

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O2

void __thiscall
myEmployeeCustomConstructor::ArchiveOUT(myEmployeeCustomConstructor *this,ChArchiveOut *marchive)

{
  ChNameValue<int> local_28;
  
  chrono::ChArchiveOut::VersionWrite<myEmployeeCustomConstructor>(marchive);
  myEmployee::ArchiveOUT(&this->super_myEmployee,marchive);
  local_28._value = &this->legs;
  local_28._name = "legs";
  local_28._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive)  //##### for Chrono serialization
    {
        // suggested: use versioning
        marchive.VersionWrite<myEmployeeCustomConstructor>();
        // remember to serialize the parent class data too!!!
        myEmployee::ArchiveOUT(marchive);
        // stream out member data (except data used in constructor, already saved in ArchiveOUTconstructor)
        marchive << CHNVP(legs);
    }